

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ClauseFlattening.cpp
# Opt level: O2

Clause * FMB::ClauseFlattening::resolveNegativeVariableEqualities(Clause *cl)

{
  Literal *pLVar1;
  ulong uVar2;
  Term *trm;
  Self lits;
  Term *elem;
  TermList sort;
  uint uVar3;
  ulong uVar4;
  bool noSharing;
  undefined8 extraout_RDX;
  undefined8 extraout_RDX_00;
  undefined8 uVar5;
  uint uVar6;
  uint uVar7;
  uint uVar8;
  uint i;
  uint uVar9;
  SingleVar2VarSubst subst;
  RStack<Literal_*> resLits;
  SingleVar2VarSubst local_98;
  Recycled<Lib::Stack<Kernel::Literal_*>,_Lib::DefaultReset,_Lib::DefaultKeepRecycled> local_90;
  uint64_t local_80;
  Stack<Kernel::Literal_*> *local_78;
  NonspecificInference1 local_70;
  Inference local_60;
  
  uVar8 = *(uint *)&cl->field_0x38 & 0xfffff;
  uVar7 = 0;
  do {
    while( true ) {
      if (uVar8 <= uVar7) {
        return cl;
      }
      pLVar1 = cl->_literals[(int)uVar7];
      if (((pLVar1->super_Term)._functor == 0) &&
         (((pLVar1->super_Term)._args[0]._content & 4) == 0)) break;
LAB_0024f15a:
      uVar7 = uVar7 + 1;
    }
    uVar3 = *(uint *)&(pLVar1->super_Term).field_0xc & 0xfffffff;
    uVar4 = (pLVar1->super_Term)._args[uVar3]._content;
    if (((uVar4 & 1) == 0) ||
       (uVar2 = (pLVar1->super_Term)._args[(ulong)uVar3 - 1]._content, (uVar2 & 1) == 0))
    goto LAB_0024f15a;
    uVar6 = (uint)(uVar4 >> 2);
    uVar3 = (uint)(uVar2 >> 2);
    if (uVar8 <= uVar7) {
      return cl;
    }
    local_98._from = uVar6;
    local_98._to = uVar3;
    Lib::Recycled<Lib::Stack<Kernel::Literal_*>,_Lib::DefaultReset,_Lib::DefaultKeepRecycled>::
    Recycled(&local_90);
    uVar5 = extraout_RDX;
    for (uVar9 = 0;
        lits._M_t.
        super___uniq_ptr_impl<Lib::Stack<Kernel::Literal_*>,_std::default_delete<Lib::Stack<Kernel::Literal_*>_>_>
        ._M_t.
        super__Tuple_impl<0UL,_Lib::Stack<Kernel::Literal_*>_*,_std::default_delete<Lib::Stack<Kernel::Literal_*>_>_>
        .super__Head_base<0UL,_Lib::Stack<Kernel::Literal_*>_*,_false>._M_head_impl =
             (__uniq_ptr_data<Lib::Stack<Kernel::Literal_*>,_std::default_delete<Lib::Stack<Kernel::Literal_*>_>,_true,_true>
              )(__uniq_ptr_data<Lib::Stack<Kernel::Literal_*>,_std::default_delete<Lib::Stack<Kernel::Literal_*>_>,_true,_true>
                )local_90._self, uVar8 != uVar9; uVar9 = uVar9 + 1) {
      if (uVar7 != uVar9) {
        local_78 = (Stack<Kernel::Literal_*> *)
                   local_90._self._M_t.
                   super___uniq_ptr_impl<Lib::Stack<Kernel::Literal_*>,_std::default_delete<Lib::Stack<Kernel::Literal_*>_>_>
                   ._M_t.
                   super__Tuple_impl<0UL,_Lib::Stack<Kernel::Literal_*>_*,_std::default_delete<Lib::Stack<Kernel::Literal_*>_>_>
                   .super__Head_base<0UL,_Lib::Stack<Kernel::Literal_*>_*,_false>._M_head_impl;
        trm = &cl->_literals[(int)uVar9]->super_Term;
        elem = trm;
        if ((uVar6 != uVar3) &&
           (elem = Kernel::SubstHelper::
                   applyImpl<false,FMB::ClauseFlattening::resolveNegativeVariableEqualities(Kernel::Clause*)::SingleVar2VarSubst>
                             (trm,&local_98,SUB81(uVar5,0)), *(int *)&elem->field_0xc < 0)) {
          local_80 = (trm->field_9)._sort._content;
          sort = Kernel::SubstHelper::
                 applyImpl<false,FMB::ClauseFlattening::resolveNegativeVariableEqualities(Kernel::Clause*)::SingleVar2VarSubst>
                           (local_80,&local_98,noSharing);
          if (local_80 != sort._content) {
            uVar4 = (ulong)(*(uint *)&elem->field_0xc & 0xfffffff);
            elem = &Kernel::Literal::createEquality
                              (SUB41(((uint)elem->_args[0]._content & 4) >> 2,0),
                               (TermList)elem->_args[uVar4]._content,
                               (TermList)elem->_args[uVar4 - 1]._content,sort)->super_Term;
          }
        }
        Lib::Stack<Kernel::Literal_*>::push(local_78,(Literal *)elem);
        uVar5 = extraout_RDX_00;
      }
    }
    local_70.rule = EQUALITY_RESOLUTION;
    local_70.premise = &cl->super_Unit;
    Kernel::Inference::Inference(&local_60,&local_70);
    cl = Kernel::Clause::fromStack
                   ((Stack<Kernel::Literal_*> *)
                    lits._M_t.
                    super___uniq_ptr_impl<Lib::Stack<Kernel::Literal_*>,_std::default_delete<Lib::Stack<Kernel::Literal_*>_>_>
                    ._M_t.
                    super__Tuple_impl<0UL,_Lib::Stack<Kernel::Literal_*>_*,_std::default_delete<Lib::Stack<Kernel::Literal_*>_>_>
                    .super__Head_base<0UL,_Lib::Stack<Kernel::Literal_*>_*,_false>._M_head_impl,
                    &local_60);
    uVar8 = uVar8 - 1;
    Lib::Recycled<Lib::Stack<Kernel::Literal_*>,_Lib::DefaultReset,_Lib::DefaultKeepRecycled>::
    ~Recycled(&local_90);
  } while( true );
}

Assistant:

Clause* ClauseFlattening::resolveNegativeVariableEqualities(Clause* cl)
{
  // a helper class to be passed to SubstHelper
  class SingleVar2VarSubst {
    unsigned _from;
    unsigned _to;
  public:
    void bind(unsigned from,unsigned to) {
      _from = from;
      _to = to;
    }
    bool isId() {
      return (_from == _to);
    }
    TermList apply(unsigned var) {
      if (var == _from) {
        return TermList(_to, false);
      } else {
        return TermList(var, false);
      }
    }
  } subst;

  // cout << "Begin: " << cl->toString() << endl;

  unsigned n = cl->length();
  unsigned idx = 0;
  while (true) {
    // scan cl from where we ended last time and look for a new negative two variable equality
    while(idx < n) {
      Literal* lit = (*cl)[idx];
      if (lit->isEquality() && lit->isNegative() && lit->nthArgument(0)->isVar() && lit->nthArgument(1)->isVar()) {
        subst.bind(lit->nthArgument(0)->var(),lit->nthArgument(1)->var());
        break;
      }
      idx++;
    }
    if (idx < n) { // we found one
      // new clause one lit shorter
      RStack<Literal*> resLits;
      for (unsigned i = 0; i < n; i++) {
        if (i != idx) { // skipping literal found at idx
          resLits->push(subst.isId() ? (*cl)[i] : SubstHelper::apply((*cl)[i],subst));
        }
      }
      cl = Clause::fromStack(*resLits, NonspecificInference1(InferenceRule::EQUALITY_RESOLUTION,cl));
      n--;
      // cout << "Update: " << cl->toString() << endl;
    } else {
      // cout << "Done: " << cl->toString() << endl;
      return cl;
    }
  }
}